

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void bumpActivity(saucy *s,sim_result *cex)

{
  void *pvVar1;
  int i;
  double dVar2;
  
  dVar2 = s->activityInc + cex->activity;
  cex->activity = dVar2;
  if (1e+20 < dVar2) {
    for (i = 0; i < s->satCounterExamples->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(s->satCounterExamples,i);
      *(double *)((long)pvVar1 + 0x18) = *(double *)((long)pvVar1 + 0x18) * 1e-20;
    }
    s->activityInc = s->activityInc * 1e-20;
  }
  return;
}

Assistant:

static void 
bumpActivity( struct saucy * s, struct sim_result * cex )
{
    int i;
    struct sim_result * cex2;

    if ( (cex->activity += s->activityInc) > 1e20 ) {
        /* Rescale: */
        for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
            cex2 = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
            cex2->activity *= 1e-20;
        }
        s->activityInc *= 1e-20; 
    } 
}